

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseRspOffsetElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  bool bVar1;
  Token *pTVar2;
  int64_t iVar3;
  int64_t local_68;
  Identifier local_60;
  string local_40;
  
  dest->type = RspOffsetElement;
  pTVar2 = Parser::peekToken(parser,0);
  if (pTVar2->type == LBrack) {
    Parser::eatToken(parser);
    pTVar2 = Parser::nextToken(parser);
    if ((pTVar2->type == Integer) && (iVar3 = Token::intValue(pTVar2), iVar3 < 0x10)) {
      local_68 = Token::intValue(pTVar2);
      tinyformat::format<long>(&local_40,"%d",&local_68);
      Identifier::Identifier(&local_60,&local_40);
      std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      iVar3 = Token::intValue(pTVar2);
      dest->num = (int)iVar3;
      pTVar2 = Parser::nextToken(parser);
      return pTVar2->type == RBrack;
    }
    bVar1 = false;
  }
  else {
    dest->num = 0;
    local_60._name._M_dataplus._M_p = (pointer)&local_60._name.field_2;
    local_60._name.field_2._M_allocated_capacity = 0;
    local_60._name.field_2._8_8_ = 0;
    local_60._name._M_string_length = 0;
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MipsParser::parseRspOffsetElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspOffsetElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		parser.eatToken();

		const Token &token = parser.nextToken();

		if (token.type != TokenType::Integer || token.intValue() >= 16)
			return false;

		dest.name = Identifier(tfm::format("%d", token.intValue()));
		dest.num = (int)token.intValue();

		return parser.nextToken().type == TokenType::RBrack;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;
}